

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O3

offset_t __thiscall PEFile::rvaToRaw(PEFile *this,offset_t rva)

{
  int iVar1;
  undefined4 extraout_var;
  SectionHdrWrapper *this_00;
  offset_t oVar2;
  offset_t oVar3;
  bufsize_t bVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  offset_t oVar5;
  WatchedLocker lock;
  WatchedLocker local_60;
  
  WatchedLocker::WatchedLocker(&local_60,&this->m_peMutex,false,"rvaToRaw");
  iVar1 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xf])(this,2);
  oVar5 = 0xffffffffffffffff;
  if (rva < CONCAT44(extraout_var,iVar1)) {
    if ((this->sects == (SectHdrsWrapper *)0x0) ||
       (this_00 = SectHdrsWrapper::getSecHdrAtOffset(this->sects,rva,RVA,true,false),
       this_00 == (SectionHdrWrapper *)0x0)) {
      iVar1 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xf])(this,1);
      if ((rva < CONCAT44(extraout_var_00,iVar1)) &&
         (((this->sects == (SectHdrsWrapper *)0x0 ||
           (iVar1 = (*(this->sects->super_PENodeWrapper).super_ExeNodeWrapper.
                      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer
                      [0x21])(), CONCAT44(extraout_var_01,iVar1) == 0)) ||
          (bVar4 = PECore::hdrsSize(&this->core), rva < bVar4)))) {
        oVar5 = rva;
      }
    }
    else {
      oVar2 = SectionHdrWrapper::getContentOffset(this_00,RVA,true);
      oVar3 = SectionHdrWrapper::getContentOffset(this_00,RAW,true);
      if (oVar3 != 0xffffffffffffffff && oVar2 != 0xffffffffffffffff) {
        bVar4 = SectionHdrWrapper::getContentSize(this_00,RAW,true);
        oVar5 = 0xffffffffffffffff;
        if (rva - oVar2 < bVar4) {
          oVar5 = oVar3 + (rva - oVar2);
        }
      }
    }
  }
  WatchedLocker::~WatchedLocker(&local_60);
  return oVar5;
}

Assistant:

offset_t PEFile::rvaToRaw(offset_t rva)
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    if (rva >= this->getMappedSize(Executable::RVA)) {
        return INVALID_ADDR;
    }
    SectionHdrWrapper* sec = this->_getSecHdrAtOffset(rva, Executable::RVA, true);
    if (sec) {
        offset_t bgnRVA = sec->getContentOffset(Executable::RVA);
        offset_t bgnRaw = sec->getContentOffset(Executable::RAW);
        if (bgnRVA  == INVALID_ADDR || bgnRaw == INVALID_ADDR) {
            return INVALID_ADDR;
        }
        bufsize_t curr = (rva - bgnRVA);
        bufsize_t rawSize = sec->getContentSize(Executable::RAW, true);
        if (curr >= rawSize) {
            // the address might be in a virtual cave that is not related to any raw address
            return INVALID_ADDR;
        }
        return bgnRaw + curr;
    }
    if (rva >= this->getMappedSize(Executable::RAW)) {
        return INVALID_ADDR;
    }
    if (this->_getSectionsCount()) { // do this check only if sections count is non-zero
        if (rva >= this->hdrsSize()) {
            // the address is in the cave between the headers and the first section: cannot be mapped
            return INVALID_ADDR;
        }
    }
    // at this point we are sure that the address is within the raw size:
    return rva;
}